

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O2

xmlNodePtr xmlnode_find_sibling(xmlNodePtr node,char *name)

{
  int iVar1;
  
  while( true ) {
    if (node == (xmlNodePtr)0x0) {
      return (xmlNodePtr)0x0;
    }
    iVar1 = xmlStrEqual(node->name,"failure");
    if (iVar1 != 0) break;
    node = (xmlNodePtr)xmlNextElementSibling(node);
  }
  return node;
}

Assistant:

static xmlNodePtr xmlnode_find_sibling(xmlNodePtr node, const char *name)
{
    while (node) {
        if (xmlStrEqual(node->name, XMLSTRING(name)))
            break;
        node = xmlNextElementSibling(node);
    }
    return node;
}